

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::removeClause(SimpSolver *this,CRef cr)

{
  uint64_t *puVar1;
  int *piVar2;
  undefined8 in_RAX;
  int i;
  ulong uVar3;
  ulong *puVar4;
  undefined8 uStack_38;
  
  puVar4 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory + cr);
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + 1;
  uStack_38 = in_RAX;
  if (this->use_simplification == true) {
    for (uVar3 = 0; uVar3 < *puVar4 >> 0x22; uVar3 = uVar3 + 1) {
      piVar2 = (this->n_occ).data + *(int *)((long)puVar4 + uVar3 * 4 + 8);
      *piVar2 = *piVar2 + -1;
      updateElimHeap(this,*(int *)((long)puVar4 + uVar3 * 4 + 8) >> 1);
      uStack_38 = CONCAT44(*(int *)((long)puVar4 + uVar3 * 4 + 8) >> 1,(undefined4)uStack_38);
      OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::smudge
                (&this->occurs,(int *)((long)&uStack_38 + 4));
    }
  }
  Solver::removeClause(&this->super_Solver,cr,true);
  return;
}

Assistant:

void SimpSolver::removeClause(CRef cr)
{
    const Clause &c = ca[cr];
    statistics.simpSteps++;

    if (use_simplification)
        for (int i = 0; i < c.size(); i++) {
            n_occ[toInt(c[i])]--;
            updateElimHeap(var(c[i]));
            occurs.smudge(var(c[i]));
        }

    Solver::removeClause(cr);
}